

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeZonePropsByTime
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate time,UBool withRDATE,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined1 local_78 [8];
  UnicodeString timestr;
  UDate time_local;
  int32_t toOffset_local;
  int32_t fromOffset_local;
  UnicodeString *zonename_local;
  UBool isDst_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  timestr.fUnion._48_8_ = time;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,(UDate)timestr.fUnion._48_8_,
                   status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      if (withRDATE != '\0') {
        VTZWriter::write(writer,0x432836,__buf,(size_t)zonename);
        VTZWriter::write(writer,0x3a,__buf_00,(size_t)zonename);
        UnicodeString::UnicodeString((UnicodeString *)local_78);
        pUVar2 = getDateTimeString((double)timestr.fUnion._48_8_ + (double)fromOffset,
                                   (UnicodeString *)local_78);
        VTZWriter::write(writer,(int)pUVar2,__buf_01,(size_t)zonename);
        VTZWriter::write(writer,0x43284e,__buf_02,(size_t)zonename);
        UnicodeString::~UnicodeString((UnicodeString *)local_78);
      }
      endZoneProps(this,writer,isDst,status);
      ::U_FAILURE(*status);
    }
  }
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByTime(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                int32_t fromOffset, int32_t toOffset, UDate time, UBool withRDATE,
                                UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, time, status);
    if (U_FAILURE(status)) {
        return;
    }
    if (withRDATE) {
        writer.write(ICAL_RDATE);
        writer.write(COLON);
        UnicodeString timestr;
        writer.write(getDateTimeString(time + fromOffset, timestr));
        writer.write(ICAL_NEWLINE);
    }
    endZoneProps(writer, isDst, status);
    if (U_FAILURE(status)) {
        return;
    }
}